

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

AffineSpace3ff * __thiscall embree::SceneGraph::TransformNode::get(TransformNode *this,float time)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_RSI;
  AffineSpace3ff *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  AffineSpace3ff xfm1;
  AffineSpace3ff xfm0;
  float ftime;
  int itime;
  BBox1f time_range;
  int numTimeSteps;
  AffineSpace3ff *xfm;
  int local_d1c;
  int local_d18;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_c88;
  undefined8 uStack_c80;
  float local_c70;
  undefined8 local_c68;
  int local_c60;
  float local_c5c;
  long local_c48;
  long local_c40;
  long local_c38;
  long local_c30;
  float local_a2c;
  undefined8 *local_a28;
  float local_a20;
  float local_a1c;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  
  local_c40 = in_RSI + 0x68;
  local_c38 = in_RSI + 0x70;
  if (*(ulong *)(in_RSI + 0x78) < 2) {
    puVar1 = *(undefined8 **)(in_RSI + 0x88);
    uVar2 = puVar1[1];
    *(undefined8 *)&(in_RDI->l).vx.field_0 = *puVar1;
    *(undefined8 *)((long)&(in_RDI->l).vx.field_0 + 8) = uVar2;
    uVar2 = puVar1[3];
    *(undefined8 *)&(in_RDI->l).vy.field_0 = puVar1[2];
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uVar2;
    uVar2 = puVar1[5];
    *(undefined8 *)&(in_RDI->l).vz.field_0 = puVar1[4];
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uVar2;
    uVar2 = puVar1[7];
    *(undefined8 *)&(in_RDI->p).field_0 = puVar1[6];
    *(undefined8 *)((long)&(in_RDI->p).field_0 + 8) = uVar2;
  }
  else {
    local_c48 = in_RSI + 0x68;
    local_c30 = in_RSI + 0x70;
    local_c60 = (int)*(undefined8 *)(in_RSI + 0x78);
    uVar2 = *(undefined8 *)(in_RSI + 0x68);
    local_c68._0_4_ = (float)uVar2;
    local_a28 = &local_c68;
    local_c68._4_4_ = (float)((ulong)uVar2 >> 0x20);
    fVar3 = (in_XMM0_Da - (float)local_c68) / (local_c68._4_4_ - (float)local_c68);
    local_c68 = uVar2;
    local_a2c = fVar3;
    local_a20 = fVar3;
    fVar4 = floorf(fVar3);
    local_c5c = (float)(local_c60 + -1) * (fVar3 - fVar4);
    local_a1c = local_c5c;
    fVar3 = floorf(local_c5c);
    local_d18 = (int)fVar3;
    if (local_d18 < 0) {
      local_d18 = 0;
    }
    local_d1c = local_c60 + -2;
    if (local_d18 < local_d1c) {
      local_d1c = local_d18;
    }
    fVar4 = 1.0 - (local_c5c - (float)local_d1c);
    local_568 = (float)local_cb8;
    fStack_564 = (float)((ulong)local_cb8 >> 0x20);
    fStack_560 = (float)uStack_cb0;
    fStack_55c = (float)((ulong)uStack_cb0 >> 0x20);
    local_5e8 = (float)local_828;
    fStack_5e4 = (float)((ulong)local_828 >> 0x20);
    fStack_5e0 = (float)uStack_820;
    fStack_5dc = (float)((ulong)uStack_820 >> 0x20);
    fVar3 = 1.0 - local_c70;
    local_6a8 = (float)local_c88;
    fStack_6a4 = (float)((ulong)local_c88 >> 0x20);
    fStack_6a0 = (float)uStack_c80;
    fStack_69c = (float)((ulong)uStack_c80 >> 0x20);
    local_728 = (float)local_7f8;
    fStack_724 = (float)((ulong)local_7f8 >> 0x20);
    fStack_720 = (float)uStack_7f0;
    fStack_71c = (float)((ulong)uStack_7f0 >> 0x20);
    *(ulong *)&(in_RDI->l).vx.field_0 =
         CONCAT44(fVar4 * fStack_564 + fStack_5e4,fVar4 * local_568 + local_5e8);
    *(ulong *)((long)&(in_RDI->l).vx.field_0 + 8) =
         CONCAT44(fVar4 * fStack_55c + fStack_5dc,fVar4 * fStack_560 + fStack_5e0);
    *(undefined8 *)&(in_RDI->l).vy.field_0 = local_918;
    *(undefined8 *)((long)&(in_RDI->l).vy.field_0 + 8) = uStack_910;
    *(undefined8 *)&(in_RDI->l).vz.field_0 = local_928;
    *(undefined8 *)((long)&(in_RDI->l).vz.field_0 + 8) = uStack_920;
    *(ulong *)&(in_RDI->p).field_0 =
         CONCAT44(fVar3 * fStack_6a4 + fStack_724,fVar3 * local_6a8 + local_728);
    *(ulong *)((long)&(in_RDI->p).field_0 + 8) =
         CONCAT44(fVar3 * fStack_69c + fStack_71c,fVar3 * fStack_6a0 + fStack_720);
  }
  return in_RDI;
}

Assistant:

virtual AffineSpace3ff get(float time) const
      {
        if (spaces.size() <= 1) return spaces[0];

        int numTimeSteps = spaces.size();
        
        BBox1f time_range = spaces.time_range;
        time = frac((time-time_range.lower)/time_range.size());
        time = (numTimeSteps-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)numTimeSteps-2);
        float ftime = time - (float)itime;
    
        const AffineSpace3ff xfm0 = spaces[itime+0];
        const AffineSpace3ff xfm1 = spaces[itime+1];
        const AffineSpace3ff xfm  = lerp(xfm0,xfm1,ftime);
        return xfm;
      }